

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O3

void helics::arrayPairProcess
               (value *doc,string *key,
               function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *pairOp)

{
  pointer pbVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  value_type *this;
  array_type *paVar5;
  string_type *psVar6;
  table_type *ptVar7;
  _Hash_node_base *p_Var8;
  basic_value<toml::type_config> *val;
  pointer this_00;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  bVar4 = fileops::isMember(doc,key);
  if (bVar4) {
    this = toml::basic_value<toml::type_config>::at(doc,key);
    if (this->type_ == array) {
      paVar5 = toml::basic_value<toml::type_config>::as_array(this);
      this_00 = (paVar5->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (paVar5->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (this_00 != pbVar1) {
        do {
          paVar5 = toml::basic_value<toml::type_config>::as_array(this_00);
          psVar6 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                             ((paVar5->
                              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
          p_Var8 = (_Hash_node_base *)(psVar6->_M_dataplus)._M_p;
          p_Var2 = (_Hash_node_base *)psVar6->_M_string_length;
          paVar5 = toml::basic_value<toml::type_config>::as_array(this_00);
          psVar6 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                             ((paVar5->
                              super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 1);
          local_50._M_str = (psVar6->_M_dataplus)._M_p;
          local_50._M_len = psVar6->_M_string_length;
          local_40._M_len = (size_t)p_Var2;
          local_40._M_str = (char *)p_Var8;
          if ((pairOp->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00230b9f:
            std::__throw_bad_function_call();
          }
          (*pairOp->_M_invoker)((_Any_data *)pairOp,&local_40,&local_50);
          this_00 = this_00 + 1;
        } while (this_00 != pbVar1);
      }
    }
    else {
      ptVar7 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(this);
      p_Var8 = (ptVar7->_M_h)._M_before_begin._M_nxt;
      if (p_Var8 != (_Hash_node_base *)0x0) {
        do {
          p_Var2 = p_Var8[1]._M_nxt;
          p_Var3 = p_Var8[2]._M_nxt;
          psVar6 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                             ((basic_value<toml::type_config> *)(p_Var8 + 5));
          local_50._M_str = (psVar6->_M_dataplus)._M_p;
          local_50._M_len = psVar6->_M_string_length;
          local_40._M_len = (size_t)p_Var3;
          local_40._M_str = (char *)p_Var2;
          if ((pairOp->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00230b9f;
          (*pairOp->_M_invoker)((_Any_data *)pairOp,&local_40,&local_50);
          p_Var8 = p_Var8->_M_nxt;
        } while (p_Var8 != (_Hash_node_base *)0x0);
      }
    }
  }
  return;
}

Assistant:

static void arrayPairProcess(toml::value doc,
                             const std::string& key,
                             const std::function<void(std::string_view, std::string_view)>& pairOp)
{
    using fileops::isMember;
    if (isMember(doc, key)) {
        auto& info = toml::find(doc, key);
        if (info.is_array()) {
            for (auto& val : info.as_array()) {
                pairOp(static_cast<std::string_view>(val.as_array()[0].as_string()),
                       static_cast<std::string_view>(val.as_array()[1].as_string()));
            }
        } else {
            for (const auto& val : info.as_table()) {
                pairOp(val.first, static_cast<std::string_view>(val.second.as_string()));
            }
        }
    }
}